

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O3

void auxsort(lua_State *L,IdxT lo,IdxT up,uint rnd)

{
  int iVar1;
  int iVar2;
  clock_t cVar3;
  time_t tVar4;
  uint uVar5;
  ulong uVar6;
  ulong n;
  uint uVar7;
  IdxT lo_00;
  ulong n_00;
  ulong uVar8;
  uint local_4c;
  ulong local_48;
  
  local_48 = (ulong)lo;
  local_4c = rnd;
  if (lo < up) {
    do {
      lo_00 = (IdxT)local_48;
      lua_geti(L,1,local_48);
      uVar6 = (ulong)up;
      lua_geti(L,1,uVar6);
      iVar1 = sort_comp(L,-1,-2);
      if (iVar1 == 0) {
        lua_settop(L,-3);
      }
      else {
        lua_seti(L,1,local_48);
        lua_seti(L,1,uVar6);
      }
      uVar7 = up - lo_00;
      if (uVar7 == 1) {
        return;
      }
      if ((uVar7 < 100) || (local_4c == 0)) {
        uVar5 = up + lo_00 >> 1;
      }
      else {
        uVar5 = (uVar7 >> 2) + lo_00 + local_4c % ((uVar7 >> 2) * 2);
      }
      n_00 = (ulong)uVar5;
      lua_geti(L,1,n_00);
      lua_geti(L,1,local_48);
      iVar1 = sort_comp(L,-2,-1);
      if (iVar1 == 0) {
        lua_settop(L,-2);
        lua_geti(L,1,uVar6);
        iVar1 = sort_comp(L,-1,-2);
        if (iVar1 != 0) {
          lua_seti(L,1,n_00);
          goto LAB_0011a2af;
        }
        lua_settop(L,-3);
      }
      else {
        lua_seti(L,1,n_00);
        uVar6 = local_48;
LAB_0011a2af:
        lua_seti(L,1,uVar6);
      }
      if (uVar7 == 2) {
        return;
      }
      lua_geti(L,1,n_00);
      lua_pushvalue(L,-1);
      n = (ulong)(up - 1);
      lua_geti(L,1,n);
      uVar6 = n;
      uVar8 = local_48;
      do {
        lua_seti(L,1,n_00);
        lua_seti(L,1,uVar6);
        iVar1 = (int)uVar8;
        n_00 = (ulong)(iVar1 + 1);
        lua_geti(L,1,n_00);
        iVar2 = sort_comp(L,-1,-2);
        uVar8 = n_00;
        if (iVar2 != 0) {
          uVar7 = iVar1 + 2;
          do {
            uVar5 = uVar7;
            if (up == uVar5) {
              luaL_error(L,"invalid order function for sorting");
            }
            lua_settop(L,-2);
            n_00 = (ulong)uVar5;
            lua_geti(L,1,n_00);
            iVar1 = sort_comp(L,-1,-2);
            uVar7 = uVar5 + 1;
          } while (iVar1 != 0);
          uVar8 = (ulong)uVar5;
        }
        while( true ) {
          uVar7 = (int)uVar6 - 1;
          uVar6 = (ulong)uVar7;
          lua_geti(L,1,uVar6);
          iVar1 = sort_comp(L,-3,-1);
          uVar5 = (uint)uVar8;
          if (iVar1 == 0) break;
          if (uVar7 < uVar5) {
            luaL_error(L,"invalid order function for sorting");
          }
          lua_settop(L,-2);
        }
      } while (uVar5 <= uVar7);
      lua_settop(L,-2);
      lua_seti(L,1,n);
      lua_seti(L,1,n_00);
      uVar7 = up - uVar5;
      if (uVar5 - lo_00 < uVar7) {
        auxsort(L,lo_00,uVar5 - 1,local_4c);
        local_48 = (ulong)(uVar5 + 1);
        uVar7 = uVar5 - lo_00;
      }
      else {
        auxsort(L,uVar5 + 1,up,local_4c);
        up = uVar5 - 1;
      }
      if (uVar7 < up - (uint)local_48 >> 7) {
        cVar3 = clock();
        tVar4 = time((time_t *)0x0);
        local_4c = (int)((ulong)tVar4 >> 0x20) + (int)((ulong)cVar3 >> 0x20) +
                   (int)tVar4 + (int)cVar3;
      }
    } while ((uint)local_48 < up);
  }
  return;
}

Assistant:

static void auxsort(lua_State *L, IdxT lo, IdxT up,
                    unsigned int rnd) {
    while (lo < up) {  /* loop for tail recursion */
        IdxT p;  /* Pivot index */
        IdxT n;  /* to be used later */
        /* sort elements 'lo', 'p', and 'up' */
        lua_geti(L, 1, lo);
        lua_geti(L, 1, up);
        if (sort_comp(L, -1, -2))  /* a[up] < a[lo]? */
            set2(L, lo, up);  /* swap a[lo] - a[up] */
        else
            lua_pop(L, 2);  /* remove both values */
        if (up - lo == 1)  /* only 2 elements? */
            return;  /* already sorted */
        if (up - lo < RANLIMIT || rnd == 0)  /* small interval or no randomize? */
            p = (lo + up) / 2;  /* middle element is a good pivot */
        else  /* for larger intervals, it is worth a random pivot */
            p = choosePivot(lo, up, rnd);
        lua_geti(L, 1, p);
        lua_geti(L, 1, lo);
        if (sort_comp(L, -2, -1))  /* a[p] < a[lo]? */
            set2(L, p, lo);  /* swap a[p] - a[lo] */
        else {
            lua_pop(L, 1);  /* remove a[lo] */
            lua_geti(L, 1, up);
            if (sort_comp(L, -1, -2))  /* a[up] < a[p]? */
                set2(L, p, up);  /* swap a[up] - a[p] */
            else
                lua_pop(L, 2);
        }
        if (up - lo == 2)  /* only 3 elements? */
            return;  /* already sorted */
        lua_geti(L, 1, p);  /* get middle element (Pivot) */
        lua_pushvalue(L, -1);  /* push Pivot */
        lua_geti(L, 1, up - 1);  /* push a[up - 1] */
        set2(L, p, up - 1);  /* swap Pivot (a[p]) with a[up - 1] */
        p = partition(L, lo, up);
        /* a[lo .. p - 1] <= a[p] == P <= a[p + 1 .. up] */
        if (p - lo < up - p) {  /* lower interval is smaller? */
            auxsort(L, lo, p - 1, rnd);  /* call recursively for lower interval */
            n = p - lo;  /* size of smaller interval */
            lo = p + 1;  /* tail call for [p + 1 .. up] (upper interval) */
        } else {
            auxsort(L, p + 1, up, rnd);  /* call recursively for upper interval */
            n = up - p;  /* size of smaller interval */
            up = p - 1;  /* tail call for [lo .. p - 1]  (lower interval) */
        }
        if ((up - lo) / 128 > n) /* partition too imbalanced? */
            rnd = l_randomizePivot();  /* try a new randomization */
    }  /* tail call auxsort(L, lo, up, rnd) */
}